

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

OPJ_BOOL opj_jp2_read_header_procedure
                   (opj_jp2_t *jp2,opj_stream_private_t *stream,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  uint uVar2;
  int iVar3;
  OPJ_BYTE *pOVar4;
  OPJ_SIZE_T OVar5;
  OPJ_OFF_T OVar6;
  ulong uVar7;
  OPJ_BYTE *p_buffer;
  char *pcVar8;
  long lVar9;
  OPJ_INT32 event_type;
  uint uVar10;
  size_t new_size;
  long lVar11;
  opj_jp2_box_t box;
  uint local_40;
  OPJ_UINT32 local_3c;
  OPJ_BYTE l_data_header [8];
  
  if (stream == (opj_stream_private_t *)0x0) {
    __assert_fail("stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8df,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8e0,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x8e1,
                  "OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  pOVar4 = (OPJ_BYTE *)opj_calloc(1,0x400);
  if (pOVar4 == (OPJ_BYTE *)0x0) {
    pcVar8 = "Not enough memory to handle jpeg2000 file header\n";
LAB_0011e461:
    opj_event_msg(p_manager,1,pcVar8);
    return 0;
  }
  local_40 = 0x400;
LAB_0011e149:
  OVar5 = opj_stream_read_data(stream,l_data_header,8,p_manager);
  if ((int)OVar5 != 8) goto LAB_0011e523;
  opj_read_bytes_LE(l_data_header,&box.length,4);
  opj_read_bytes_LE(l_data_header + 4,&box.type,4);
  if (box.length != 1) {
    uVar10 = 8;
    if (box.length != 0) goto LAB_0011e221;
    OVar6 = opj_stream_get_number_byte_left(stream);
    if (OVar6 < 0xfffffff8) {
      box.length = (int)OVar6 + 8;
      if (OVar6 + 8U != (ulong)box.length) {
        __assert_fail("(OPJ_OFF_T)box->length == bleft + 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                      ,0x1f9,
                      "OPJ_BOOL opj_jp2_read_boxhdr(opj_jp2_box_t *, OPJ_UINT32 *, opj_stream_private_t *, opj_event_mgr_t *)"
                     );
      }
      goto LAB_0011e221;
    }
LAB_0011e4b0:
    pcVar8 = "Cannot handle box sizes higher than 2^32\n";
    event_type = 1;
    goto LAB_0011e51c;
  }
  OVar5 = opj_stream_read_data(stream,l_data_header,8,p_manager);
  if ((int)OVar5 != 8) goto LAB_0011e523;
  opj_read_bytes_LE(l_data_header,&local_3c,4);
  if (local_3c != 0) goto LAB_0011e4b0;
  opj_read_bytes_LE(l_data_header + 4,&box.length,4);
  uVar10 = 0x10;
LAB_0011e221:
  if (box.type == 0x6a703263) {
    if ((jp2->jp2_state & 4) != 0) {
      jp2->jp2_state = jp2->jp2_state | 8;
      goto LAB_0011e523;
    }
    pcVar8 = "bad placed jpeg codestream\n";
  }
  else {
    if (box.length != 0) {
      uVar2 = box.length - uVar10;
      if (uVar10 <= box.length) goto code_r0x0011e252;
      opj_event_msg(p_manager,1,"invalid box size %d (%x)\n",(ulong)box.length,(ulong)box.type);
      goto LAB_0011e506;
    }
    pcVar8 = "Cannot handle box of undefined sizes\n";
  }
  goto LAB_0011e4f5;
code_r0x0011e252:
  lVar11 = 0;
  do {
    if (*(OPJ_UINT32 *)((long)&jp2_header[0].id + lVar11) == box.type) {
      lVar11 = (long)&jp2_header[0].id + lVar11;
      goto LAB_0011e26d;
    }
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x30);
  lVar11 = 0;
LAB_0011e26d:
  lVar9 = 0;
  do {
    if (*(OPJ_UINT32 *)((long)&jp2_img_header[0].id + lVar9) == box.type) {
      new_size = (size_t)(box.length - uVar10);
      if (lVar11 != 0) goto LAB_0011e3bc;
      opj_event_msg(p_manager,2,"Found a misplaced \'%c%c%c%c\' box outside jp2h box\n",
                    (ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                    (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff));
      if ((jp2->jp2_state & 4) != 0) {
        lVar11 = (long)&jp2_img_header[0].id + lVar9;
        goto LAB_0011e3bc;
      }
      opj_event_msg(p_manager,2,
                    "JPEG2000 Header box not read yet, \'%c%c%c%c\' box will be ignored\n",
                    (ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                    (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff));
      jp2->jp2_state = jp2->jp2_state | 0x7fffffff;
      uVar7 = opj_stream_skip(stream,new_size,p_manager);
      if (uVar7 == new_size) goto LAB_0011e149;
      goto LAB_0011e4e9;
    }
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x60);
  if (lVar11 == 0) {
    uVar10 = jp2->jp2_state;
    if ((uVar10 & 1) == 0) {
      pcVar8 = "Malformed JP2 file format: first box must be JPEG 2000 signature box\n";
      goto LAB_0011e4f5;
    }
    if ((uVar10 & 2) == 0) {
      pcVar8 = "Malformed JP2 file format: second box must be file type box\n";
      goto LAB_0011e4f5;
    }
    jp2->jp2_state = uVar10 | 0x7fffffff;
    uVar7 = opj_stream_skip(stream,(ulong)uVar2,p_manager);
    if (uVar7 != uVar2) {
      if ((jp2->jp2_state & 8) != 0) {
        pcVar8 = "Problem with skipping JPEG2000 box, stream error\n";
        event_type = 2;
LAB_0011e51c:
        opj_event_msg(p_manager,event_type,pcVar8);
LAB_0011e523:
        opj_free(pOVar4);
        return 1;
      }
LAB_0011e4e9:
      pcVar8 = "Problem with skipping JPEG2000 box, stream error\n";
LAB_0011e4f5:
      opj_event_msg(p_manager,1,pcVar8);
LAB_0011e506:
      opj_free(pOVar4);
      return 0;
    }
  }
  else {
    new_size = (size_t)uVar2;
LAB_0011e3bc:
    uVar10 = (uint)new_size;
    OVar6 = opj_stream_get_number_byte_left(stream);
    OVar1 = box.length;
    if (OVar6 < (long)new_size) {
      OVar6 = opj_stream_get_number_byte_left(stream);
      opj_event_msg(p_manager,1,
                    "Invalid box size %d for box \'%c%c%c%c\'. Need %d bytes, %d bytes remaining \n"
                    ,OVar1,(ulong)(box.type >> 0x18),(ulong)(box.type >> 0x10 & 0xff),
                    (ulong)(box.type >> 8 & 0xff),(ulong)(box.type & 0xff),new_size,OVar6);
      goto LAB_0011e506;
    }
    p_buffer = pOVar4;
    if ((local_40 < uVar10) &&
       (p_buffer = (OPJ_BYTE *)opj_realloc(pOVar4,new_size), local_40 = uVar10,
       p_buffer == (OPJ_BYTE *)0x0)) {
      opj_free(pOVar4);
      pcVar8 = "Not enough memory to handle jpeg2000 box\n";
      goto LAB_0011e461;
    }
    OVar5 = opj_stream_read_data(stream,p_buffer,new_size,p_manager);
    pOVar4 = p_buffer;
    if (uVar10 != (uint)OVar5) {
      opj_event_msg(p_manager,1,"Problem with reading JPEG2000 box, stream error\n");
      goto LAB_0011e506;
    }
    iVar3 = (**(code **)(lVar11 + 8))(jp2,p_buffer,new_size,p_manager);
    if (iVar3 == 0) {
      opj_free(p_buffer);
      return 0;
    }
  }
  goto LAB_0011e149;
}

Assistant:

static OPJ_BOOL opj_jp2_read_header_procedure(opj_jp2_t *jp2,
        opj_stream_private_t *stream,
        opj_event_mgr_t * p_manager
                                             )
{
    opj_jp2_box_t box;
    OPJ_UINT32 l_nb_bytes_read;
    const opj_jp2_header_handler_t * l_current_handler;
    const opj_jp2_header_handler_t * l_current_handler_misplaced;
    OPJ_UINT32 l_last_data_size = OPJ_BOX_SIZE;
    OPJ_UINT32 l_current_data_size;
    OPJ_BYTE * l_current_data = 00;

    /* preconditions */
    assert(stream != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);

    l_current_data = (OPJ_BYTE*)opj_calloc(1, l_last_data_size);

    if (l_current_data == 00) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Not enough memory to handle jpeg2000 file header\n");
        return OPJ_FALSE;
    }

    while (opj_jp2_read_boxhdr(&box, &l_nb_bytes_read, stream, p_manager)) {
        /* is it the codestream box ? */
        if (box.type == JP2_JP2C) {
            if (jp2->jp2_state & JP2_STATE_HEADER) {
                jp2->jp2_state |= JP2_STATE_CODESTREAM;
                opj_free(l_current_data);
                return OPJ_TRUE;
            } else {
                opj_event_msg(p_manager, EVT_ERROR, "bad placed jpeg codestream\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        } else if (box.length == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "Cannot handle box of undefined sizes\n");
            opj_free(l_current_data);
            return OPJ_FALSE;
        }
        /* testcase 1851.pdf.SIGSEGV.ce9.948 */
        else if (box.length < l_nb_bytes_read) {
            opj_event_msg(p_manager, EVT_ERROR, "invalid box size %d (%x)\n", box.length,
                          box.type);
            opj_free(l_current_data);
            return OPJ_FALSE;
        }

        l_current_handler = opj_jp2_find_handler(box.type);
        l_current_handler_misplaced = opj_jp2_img_find_handler(box.type);
        l_current_data_size = box.length - l_nb_bytes_read;

        if ((l_current_handler != 00) || (l_current_handler_misplaced != 00)) {
            if (l_current_handler == 00) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Found a misplaced '%c%c%c%c' box outside jp2h box\n",
                              (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                              (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0));
                if (jp2->jp2_state & JP2_STATE_HEADER) {
                    /* read anyway, we already have jp2h */
                    l_current_handler = l_current_handler_misplaced;
                } else {
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "JPEG2000 Header box not read yet, '%c%c%c%c' box will be ignored\n",
                                  (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                                  (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0));
                    jp2->jp2_state |= JP2_STATE_UNKNOWN;
                    if (opj_stream_skip(stream, l_current_data_size,
                                        p_manager) != l_current_data_size) {
                        opj_event_msg(p_manager, EVT_ERROR,
                                      "Problem with skipping JPEG2000 box, stream error\n");
                        opj_free(l_current_data);
                        return OPJ_FALSE;
                    }
                    continue;
                }
            }
            if ((OPJ_OFF_T)l_current_data_size > opj_stream_get_number_byte_left(stream)) {
                /* do not even try to malloc if we can't read */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid box size %d for box '%c%c%c%c'. Need %d bytes, %d bytes remaining \n",
                              box.length, (OPJ_BYTE)(box.type >> 24), (OPJ_BYTE)(box.type >> 16),
                              (OPJ_BYTE)(box.type >> 8), (OPJ_BYTE)(box.type >> 0), l_current_data_size,
                              (OPJ_UINT32)opj_stream_get_number_byte_left(stream));
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            if (l_current_data_size > l_last_data_size) {
                OPJ_BYTE* new_current_data = (OPJ_BYTE*)opj_realloc(l_current_data,
                                             l_current_data_size);
                if (!new_current_data) {
                    opj_free(l_current_data);
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Not enough memory to handle jpeg2000 box\n");
                    return OPJ_FALSE;
                }
                l_current_data = new_current_data;
                l_last_data_size = l_current_data_size;
            }

            l_nb_bytes_read = (OPJ_UINT32)opj_stream_read_data(stream, l_current_data,
                              l_current_data_size, p_manager);
            if (l_nb_bytes_read != l_current_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Problem with reading JPEG2000 box, stream error\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }

            if (! l_current_handler->handler(jp2, l_current_data, l_current_data_size,
                                             p_manager)) {
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
        } else {
            if (!(jp2->jp2_state & JP2_STATE_SIGNATURE)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Malformed JP2 file format: first box must be JPEG 2000 signature box\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            if (!(jp2->jp2_state & JP2_STATE_FILE_TYPE)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Malformed JP2 file format: second box must be file type box\n");
                opj_free(l_current_data);
                return OPJ_FALSE;
            }
            jp2->jp2_state |= JP2_STATE_UNKNOWN;
            if (opj_stream_skip(stream, l_current_data_size,
                                p_manager) != l_current_data_size) {
                if (jp2->jp2_state & JP2_STATE_CODESTREAM) {
                    /* If we already read the codestream, do not error out */
                    /* Needed for data/input/nonregression/issue254.jp2 */
                    opj_event_msg(p_manager, EVT_WARNING,
                                  "Problem with skipping JPEG2000 box, stream error\n");
                    opj_free(l_current_data);
                    return OPJ_TRUE;
                } else {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Problem with skipping JPEG2000 box, stream error\n");
                    opj_free(l_current_data);
                    return OPJ_FALSE;
                }
            }
        }
    }

    opj_free(l_current_data);

    return OPJ_TRUE;
}